

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

int __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::remove
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this,char *__filename)

{
  int iVar1;
  int idx;
  int first;
  int j;
  int k;
  int local_1c;
  int local_18;
  int local_14;
  
  local_1c = -1;
  local_18 = 0;
  for (local_14 = 0; iVar1 = num(this), local_14 < iVar1; local_14 = local_14 + 1) {
    if (*(int *)(__filename + (long)local_14 * 4) < 0) {
      iVar1 = this->thekey[local_14].idx;
      this->theitem[iVar1].info = this->firstfree;
      this->firstfree = -1 - iVar1;
      if (local_1c < 0) {
        local_1c = local_14;
      }
    }
    else {
      *(int *)(__filename + (long)local_14 * 4) = local_18;
      local_18 = local_18 + 1;
    }
  }
  if (-1 < local_1c) {
    local_14 = local_1c;
    iVar1 = num(this);
    for (; local_14 < iVar1; local_14 = local_14 + 1) {
      if (*(int *)(__filename + (long)local_14 * 4) < 0) {
        this->thenum = this->thenum + -1;
      }
      else {
        this->thekey[*(int *)(__filename + (long)local_14 * 4)] = this->thekey[local_14];
        this->theitem[this->thekey[local_14].idx].info = *(int *)(__filename + (long)local_14 * 4);
        this->thekey[local_14].idx = -1;
      }
    }
  }
  return local_14;
}

Assistant:

void remove(int perm[])
   {
      int k, j, first = -1;

      // setup permutation and remove items
      for(k = j = 0; k < num(); ++k)
      {
         if(perm[k] >= 0)       // j has not been removed ...
            perm[k] = j++;
         else
         {
            int idx = thekey[k].idx;
            theitem[idx].info = firstfree;
            firstfree = -idx - 1;

            if(first < 0)
               first = k;
         }
      }

      if(first >= 0)         // move remaining items
      {
         for(k = first, j = num(); k < j; ++k)
         {
            if(perm[k] >= 0)
            {
               thekey[perm[k]] = thekey[k];
               theitem[thekey[k].idx].info = perm[k];
               thekey[k].idx = -1;
            }
            else
               --thenum;
         }
      }
   }